

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

ostream * AixLog::operator<<(ostream *os,TextColor *text_color)

{
  int *in_RSI;
  ostream *in_RDI;
  
  std::operator<<(in_RDI,"\x1b[");
  if ((*in_RSI == 0) && (in_RSI[1] == 0)) {
    std::operator<<(in_RDI,"0");
  }
  if ((*in_RSI != 0) && (std::ostream::operator<<(in_RDI,*in_RSI + 0x1d), in_RSI[1] != 0)) {
    std::operator<<(in_RDI,";");
  }
  if (in_RSI[1] != 0) {
    std::ostream::operator<<(in_RDI,in_RSI[1] + 0x27);
  }
  std::operator<<(in_RDI,"m");
  return in_RDI;
}

Assistant:

static std::ostream& operator<<(std::ostream& os, const TextColor& text_color) {
  os << "\033[";
  if ((text_color.foreground == Color::none) &&
      (text_color.background == Color::none))
    os << "0";  // reset colors if no params

  if (text_color.foreground != Color::none) {
    os << 29 + static_cast<int>(text_color.foreground);
    if (text_color.background != Color::none) os << ";";
  }
  if (text_color.background != Color::none)
    os << 39 + static_cast<int>(text_color.background);
  os << "m";

  return os;
}